

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep_io.c
# Opt level: O0

int ARKStepSetMaxNonlinIters(void *arkode_mem,int maxcor)

{
  int iVar1;
  int in_ESI;
  int retval;
  ARKodeARKStepMem step_mem;
  ARKodeMem ark_mem;
  SUNNonlinearSolver in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  void *in_stack_ffffffffffffffd8;
  ARKodeMem local_20;
  int local_4;
  
  local_4 = arkStep_AccessStepMem
                      (in_stack_ffffffffffffffd8,
                       (char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                       (ARKodeMem *)in_stack_ffffffffffffffc8,(ARKodeARKStepMem *)0x1126028);
  if (local_4 == 0) {
    if (*(long *)((long)in_stack_ffffffffffffffd8 + 0x78) == 0) {
      arkProcessError(local_20,-0x20,"ARKode::ARKStep","ARKStepSetMaxNonlinIters",
                      "No SUNNonlinearSolver object is present");
      local_4 = -0x16;
    }
    else {
      if (in_ESI < 1) {
        *(undefined4 *)((long)in_stack_ffffffffffffffd8 + 0xf8) = 3;
      }
      else {
        *(int *)((long)in_stack_ffffffffffffffd8 + 0xf8) = in_ESI;
      }
      iVar1 = SUNNonlinSolSetMaxIters(in_stack_ffffffffffffffc8,0);
      if (iVar1 == 0) {
        local_4 = 0;
      }
      else {
        arkProcessError(local_20,-0x20,"ARKode::ARKStep","ARKStepSetMaxNonlinIters",
                        "Error setting maxcor in SUNNonlinearSolver object");
        local_4 = -0x20;
      }
    }
  }
  return local_4;
}

Assistant:

int ARKStepSetMaxNonlinIters(void *arkode_mem, int maxcor)
{
  ARKodeMem ark_mem;
  ARKodeARKStepMem step_mem;
  int retval;

  /* access ARKodeARKStepMem structure */
  retval = arkStep_AccessStepMem(arkode_mem, "ARKStepSetMaxNonlinIters",
                                 &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS)  return(retval);

  /* Return error message if no NLS module is present */
  if (step_mem->NLS == NULL) {
    arkProcessError(ark_mem, ARK_NLS_OP_ERR, "ARKode::ARKStep",
                    "ARKStepSetMaxNonlinIters",
                    "No SUNNonlinearSolver object is present");
    return(ARK_ILL_INPUT);
  }

  /* argument <= 0 sets default, otherwise set input */
  if (maxcor <= 0) {
    step_mem->maxcor = MAXCOR;
  } else {
    step_mem->maxcor = maxcor;
  }

  /* send argument to NLS structure */
  retval = SUNNonlinSolSetMaxIters(step_mem->NLS, step_mem->maxcor);
  if (retval != SUN_NLS_SUCCESS) {
    arkProcessError(ark_mem, ARK_NLS_OP_ERR, "ARKode::ARKStep",
                    "ARKStepSetMaxNonlinIters",
                    "Error setting maxcor in SUNNonlinearSolver object");
    return(ARK_NLS_OP_ERR);
  }

  return(ARK_SUCCESS);
}